

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O2

bool __thiscall ON_Buffer::Compact(ON_Buffer *this)

{
  ulong uVar1;
  ON_BUFFER_SEGMENT *memblock;
  ON_BUFFER_SEGMENT *pOVar2;
  ON_BUFFER_SEGMENT *__src;
  ON_BUFFER_SEGMENT *pOVar3;
  ON_BUFFER_SEGMENT *pOVar4;
  size_t __n;
  
  uVar1 = this->m_buffer_size;
  if (uVar1 == 0) {
    ChangeSize(this,0);
    this->m_current_segment = (ON_BUFFER_SEGMENT *)0x0;
  }
  else {
    memblock = this->m_last_segment;
    if (((memblock != (ON_BUFFER_SEGMENT *)0x0) &&
        (__n = uVar1 - memblock->m_segment_position0,
        memblock->m_segment_position0 <= uVar1 && __n != 0)) &&
       (uVar1 < memblock->m_segment_position1)) {
      pOVar2 = memblock->m_prev_segment;
      __src = (ON_BUFFER_SEGMENT *)memblock->m_segment_buffer;
      pOVar3 = (ON_BUFFER_SEGMENT *)onrealloc(memblock,__n + 0x30);
      if (pOVar3 != (ON_BUFFER_SEGMENT *)0x0) {
        pOVar4 = this->m_last_segment;
        if (!(bool)(~(__src != (ON_BUFFER_SEGMENT *)0x0 && __src != memblock + 1) & pOVar3 == pOVar4
                   )) {
          pOVar3->m_segment_buffer = (uchar *)(pOVar3 + 1);
          if (__src != (ON_BUFFER_SEGMENT *)0x0 && __src != memblock + 1) {
            memcpy(pOVar3 + 1,__src,__n);
            onfree(__src);
            pOVar4 = this->m_last_segment;
          }
          pOVar3->m_prev_segment = pOVar2;
          pOVar3->m_next_segment = (ON_BUFFER_SEGMENT *)0x0;
          if (this->m_first_segment == pOVar4) {
            this->m_first_segment = pOVar3;
          }
          if (this->m_current_segment == pOVar4) {
            this->m_current_segment = pOVar3;
          }
          this->m_last_segment = pOVar3;
          pOVar4 = pOVar3;
          if (pOVar2 != (ON_BUFFER_SEGMENT *)0x0) {
            pOVar2->m_next_segment = pOVar3;
          }
        }
        pOVar4->m_segment_position1 = this->m_buffer_size;
      }
    }
  }
  return true;
}

Assistant:

bool ON_Buffer::Compact()
{
  bool rc = false;
  if ( 0 == m_buffer_size )
  {
    rc = ChangeSize(0); // frees all heap and zeros everything but m_current_position.
    m_current_segment = 0;
  }
  else if ( 0 != m_last_segment 
            && m_buffer_size > m_last_segment->m_segment_position0
            && m_buffer_size <= m_last_segment->m_segment_position1
            )
  {
    if ( m_buffer_size == m_last_segment->m_segment_position1 )
      rc = true;
    else
    {
      ON__UINT64 sizeof_segment_buffer = m_buffer_size - m_last_segment->m_segment_position0;
      struct ON_BUFFER_SEGMENT* prev_segment = m_last_segment->m_prev_segment;
      void* last_buffer = ( 0 != m_last_segment->m_segment_buffer && m_last_segment->m_segment_buffer != (unsigned char*)(m_last_segment+1) )
                        ? m_last_segment->m_segment_buffer
                        : 0;
      struct ON_BUFFER_SEGMENT* new_last_segment = (struct ON_BUFFER_SEGMENT*)onrealloc(m_last_segment,sizeof(*m_last_segment) + ((size_t)sizeof_segment_buffer)); // sizeof_segment_buffer always < 0xFFFFFFFF
      if ( 0 != new_last_segment )
      {
        if ( new_last_segment != m_last_segment || 0 != last_buffer )
        {
          new_last_segment->m_segment_buffer = (unsigned char*)(new_last_segment+1);
          if ( 0 != last_buffer )
          {
            memcpy(new_last_segment->m_segment_buffer,last_buffer,(size_t)sizeof_segment_buffer);
            onfree(last_buffer);
            last_buffer = 0;
          }
          new_last_segment->m_prev_segment = prev_segment;
          new_last_segment->m_next_segment = 0;
          if ( m_first_segment == m_last_segment )
            m_first_segment = new_last_segment;
          if ( m_current_segment == m_last_segment )
            m_current_segment = new_last_segment;
          m_last_segment = new_last_segment;
          if ( 0 != prev_segment )
          {
            prev_segment->m_next_segment = m_last_segment;
          }
        }
        m_last_segment->m_segment_position1 = m_buffer_size;
        rc = true;
      }
    }
  }
  return true;
}